

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImFontAtlasBuildSetupFont
               (ImFontAtlas *atlas,ImFont *font,ImFontConfig *font_config,float ascent,float descent
               )

{
  undefined2 uVar1;
  short sVar2;
  
  if (font_config->MergeMode == true) {
    uVar1 = font->ConfigDataCount;
    sVar2 = uVar1 + 1;
  }
  else {
    ImFont::ClearOutputData(font);
    font->FontSize = font_config->SizePixels;
    font->ConfigData = font_config;
    font->ContainerAtlas = atlas;
    font->Ascent = ascent;
    font->Descent = descent;
    sVar2 = 1;
  }
  font->ConfigDataCount = sVar2;
  return;
}

Assistant:

void ImFontAtlasBuildSetupFont(ImFontAtlas* atlas, ImFont* font, ImFontConfig* font_config, float ascent, float descent)
{
    if (!font_config->MergeMode)
    {
        font->ClearOutputData();
        font->FontSize = font_config->SizePixels;
        font->ConfigData = font_config;
        font->ConfigDataCount = 0;
        font->ContainerAtlas = atlas;
        font->Ascent = ascent;
        font->Descent = descent;
    }
    font->ConfigDataCount++;
}